

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap-types.cpp
# Opt level: O2

vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> * __thiscall
wasm::anon_unknown_24::HeapTypeGeneratorImpl::
getKindCandidates<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind>
          (vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *__return_storage_ptr__,
          HeapTypeGeneratorImpl *this,Shareability share)

{
  uint uVar1;
  pointer pvVar2;
  Shareability SVar3;
  ulong uVar4;
  HeapType local_50;
  Entry local_48;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *local_38;
  
  (__return_storage_ptr__->super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  uVar1 = (this->recGroupEnds).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_start[this->index];
  local_38 = __return_storage_ptr__;
  for (uVar4 = 0; uVar1 != uVar4; uVar4 = uVar4 + 1) {
    pvVar2 = (this->typeKinds).
             super__Vector_base<std::variant<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>,_std::allocator<std::variant<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((pvVar2 != (pointer)0x0) &&
       (*(__index_type *)
         ((long)&pvVar2[uVar4].
                 super__Variant_base<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>
                 .
                 super__Move_assign_alias<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>
                 .
                 super__Copy_assign_alias<wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::SignatureKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::StructKind,_wasm::(anonymous_namespace)::HeapTypeGeneratorImpl::ArrayKind>
         + 1) == '\x01')) {
      local_48.builder = this->builder;
      local_48.index = uVar4;
      local_50 = TypeBuilder::Entry::operator_cast_to_HeapType(&local_48);
      SVar3 = wasm::HeapType::getShared();
      if (SVar3 == share) {
        local_48.builder = this->builder;
        local_48.index = uVar4;
        local_50 = TypeBuilder::Entry::operator_cast_to_HeapType(&local_48);
        std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::emplace_back<wasm::HeapType>
                  (local_38,&local_50);
      }
    }
  }
  return local_38;
}

Assistant:

std::vector<HeapType> getKindCandidates(Shareability share) {
    std::vector<HeapType> candidates;
    // Iterate through the top level kinds, finding matches for `Kind`. Since we
    // are constructing a child, we can only look through the end of the current
    // recursion group.
    for (Index i = 0, end = recGroupEnds[index]; i < end; ++i) {
      if (std::get_if<Kind>(&typeKinds[i]) &&
          share == HeapType(builder[i]).getShared()) {
        candidates.push_back(builder[i]);
      }
    }
    return candidates;
  }